

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O1

void pzshape::TPZShapeCube::ShapeCornerCube(TPZVec<Fad<double>_> *pt,TPZVec<Fad<double>_> *phi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  FADREAL x [2];
  FADREAL y [2];
  FADREAL z [2];
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_118;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_108;
  Fad<double> local_f8;
  Fad<double> local_d8;
  Fad<double> local_b8;
  Fad<double> local_98;
  Fad<double> local_78;
  Fad<double> local_58;
  
  lVar5 = 0;
  do {
    Fad<double>::Fad((Fad<double> *)((long)&local_f8.val_ + lVar5));
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    Fad<double>::Fad((Fad<double> *)((long)&local_b8.val_ + lVar5));
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    Fad<double>::Fad((Fad<double> *)((long)&local_78.val_ + lVar5));
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  pFVar2 = pt->fStore;
  uVar1 = (pFVar2->dx_).num_elts;
  if (uVar1 != local_f8.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_f8.dx_.num_elts != 0) {
        if (local_f8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_f8.dx_.ptr_to_data);
        }
        local_f8.dx_.num_elts = 0;
        local_f8.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_f8.dx_.num_elts != 0) {
        if (local_f8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_f8.dx_.ptr_to_data);
        }
        local_f8.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_f8.dx_.num_elts = uVar1;
      local_f8.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if ((pFVar2->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_f8.dx_.ptr_to_data[uVar4] = pFVar2->defaultVal * -0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = (pFVar2->dx_).ptr_to_data;
      uVar4 = 0;
      do {
        local_f8.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * -0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_f8.val_ = (1.0 - pFVar2->val_) * 0.5;
  pFVar2 = pt->fStore;
  uVar1 = (pFVar2->dx_).num_elts;
  if (uVar1 != local_d8.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_d8.dx_.num_elts != 0) {
        if (local_d8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_d8.dx_.ptr_to_data);
        }
        local_d8.dx_.num_elts = 0;
        local_d8.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_d8.dx_.num_elts != 0) {
        if (local_d8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_d8.dx_.ptr_to_data);
        }
        local_d8.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_d8.dx_.num_elts = uVar1;
      local_d8.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if ((pFVar2->dx_).num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_d8.dx_.ptr_to_data[uVar4] = pFVar2->defaultVal * 0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = (pFVar2->dx_).ptr_to_data;
      uVar4 = 0;
      do {
        local_d8.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * 0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_d8.val_ = (pFVar2->val_ + 1.0) * 0.5;
  pFVar2 = pt->fStore;
  uVar1 = pFVar2[1].dx_.num_elts;
  if (uVar1 != local_b8.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_b8.dx_.num_elts != 0) {
        if (local_b8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_b8.dx_.ptr_to_data);
        }
        local_b8.dx_.num_elts = 0;
        local_b8.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_b8.dx_.num_elts != 0) {
        if (local_b8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_b8.dx_.ptr_to_data);
        }
        local_b8.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_b8.dx_.num_elts = uVar1;
      local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if (pFVar2[1].dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_b8.dx_.ptr_to_data[uVar4] = pFVar2[1].defaultVal * -0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = pFVar2[1].dx_.ptr_to_data;
      uVar4 = 0;
      do {
        local_b8.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * -0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_b8.val_ = (1.0 - pFVar2[1].val_) * 0.5;
  pFVar2 = pt->fStore;
  uVar1 = pFVar2[1].dx_.num_elts;
  if (uVar1 != local_98.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_98.dx_.num_elts != 0) {
        if (local_98.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_98.dx_.ptr_to_data);
        }
        local_98.dx_.num_elts = 0;
        local_98.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_98.dx_.num_elts != 0) {
        if (local_98.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_98.dx_.ptr_to_data);
        }
        local_98.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_98.dx_.num_elts = uVar1;
      local_98.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if (pFVar2[1].dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_98.dx_.ptr_to_data[uVar4] = pFVar2[1].defaultVal * 0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = pFVar2[1].dx_.ptr_to_data;
      uVar4 = 0;
      do {
        local_98.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * 0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_98.val_ = (pFVar2[1].val_ + 1.0) * 0.5;
  pFVar2 = pt->fStore;
  uVar1 = pFVar2[2].dx_.num_elts;
  if (uVar1 != local_78.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_78.dx_.num_elts != 0) {
        if (local_78.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_78.dx_.ptr_to_data);
        }
        local_78.dx_.num_elts = 0;
        local_78.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_78.dx_.num_elts != 0) {
        if (local_78.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_78.dx_.ptr_to_data);
        }
        local_78.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_78.dx_.num_elts = uVar1;
      local_78.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if (pFVar2[2].dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_78.dx_.ptr_to_data[uVar4] = pFVar2[2].defaultVal * -0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = pFVar2[2].dx_.ptr_to_data;
      uVar4 = 0;
      do {
        local_78.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * -0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_78.val_ = (1.0 - pFVar2[2].val_) * 0.5;
  pFVar2 = pt->fStore;
  uVar1 = pFVar2[2].dx_.num_elts;
  if (uVar1 != local_58.dx_.num_elts) {
    if (uVar1 == 0) {
      if (local_58.dx_.num_elts != 0) {
        if (local_58.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_58.dx_.ptr_to_data);
        }
        local_58.dx_.num_elts = 0;
        local_58.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (local_58.dx_.num_elts != 0) {
        if (local_58.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_58.dx_.ptr_to_data);
        }
        local_58.dx_.ptr_to_data = (double *)0x0;
      }
      uVar4 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar4 = (long)(int)uVar1 << 3;
      }
      local_58.dx_.num_elts = uVar1;
      local_58.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    }
  }
  if (uVar1 != 0) {
    if (pFVar2[2].dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          local_58.dx_.ptr_to_data[uVar4] = pFVar2[2].defaultVal * 0.5;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar3 = pFVar2[2].dx_.ptr_to_data;
      uVar4 = 0;
      do {
        local_58.dx_.ptr_to_data[uVar4] = pdVar3[uVar4] * 0.5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  local_58.val_ = (pFVar2[2].val_ + 1.0) * 0.5;
  local_118.fadexpr_.left_ = &local_f8;
  local_118.fadexpr_.right_ = &local_b8;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_78;
  Fad<double>::operator=(phi->fStore,&local_108);
  local_118.fadexpr_.left_ = &local_d8;
  local_118.fadexpr_.right_ = &local_b8;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_78;
  Fad<double>::operator=(phi->fStore + 1,&local_108);
  local_118.fadexpr_.left_ = &local_d8;
  local_118.fadexpr_.right_ = &local_98;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_78;
  Fad<double>::operator=(phi->fStore + 2,&local_108);
  local_118.fadexpr_.left_ = &local_f8;
  local_118.fadexpr_.right_ = &local_98;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_78;
  Fad<double>::operator=(phi->fStore + 3,&local_108);
  local_118.fadexpr_.left_ = &local_f8;
  local_118.fadexpr_.right_ = &local_b8;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_58;
  Fad<double>::operator=(phi->fStore + 4,&local_108);
  local_118.fadexpr_.left_ = &local_d8;
  local_118.fadexpr_.right_ = &local_b8;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_58;
  Fad<double>::operator=(phi->fStore + 5,&local_108);
  local_118.fadexpr_.left_ = &local_d8;
  local_118.fadexpr_.right_ = &local_98;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_58;
  Fad<double>::operator=(phi->fStore + 6,&local_108);
  local_118.fadexpr_.left_ = &local_f8;
  local_118.fadexpr_.right_ = &local_98;
  local_108.fadexpr_.left_ = &local_118;
  local_108.fadexpr_.right_ = &local_58;
  Fad<double>::operator=(phi->fStore + 7,&local_108);
  lVar5 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&local_78.val_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&local_b8.val_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x20;
  do {
    Fad<double>::~Fad((Fad<double> *)((long)&local_f8.val_ + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  return;
}

Assistant:

void TPZShapeCube::ShapeCornerCube(TPZVec<FADREAL> &pt, TPZVec<FADREAL> &phi)
	{
		FADREAL x[2], y[2], z[2];
		
		x[0]  = (REAL(1.)-pt[0])/REAL(2.);
		x[1]  = (REAL(1.)+pt[0])/REAL(2.);
		y[0]  = (REAL(1.)-pt[1])/REAL(2.);
		y[1]  = (REAL(1.)+pt[1])/REAL(2.);
		z[0]  = (REAL(1.)-pt[2])/REAL(2.);
		z[1]  = (REAL(1.)+pt[2])/REAL(2.);
		
		phi[0]  = x[0]*y[0]*z[0];
		phi[1]  = x[1]*y[0]*z[0];
		phi[2]  = x[1]*y[1]*z[0];
		phi[3]  = x[0]*y[1]*z[0];
		phi[4]  = x[0]*y[0]*z[1];
		phi[5]  = x[1]*y[0]*z[1];
		phi[6]  = x[1]*y[1]*z[1];
		phi[7]  = x[0]*y[1]*z[1];
	}